

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O2

vector_t ** alloc_gau_acc(uint32 n_stream,uint32 n_density,uint32 *veclen,uint32 blksize)

{
  vector_t **pppfVar1;
  void *pvVar2;
  uint uVar3;
  bool bVar4;
  ulong uVar5;
  undefined4 in_register_00000034;
  
  pppfVar1 = (vector_t **)
             __ckd_calloc_2d__(1,(ulong)n_stream,8,
                               "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/kmeans_init/main.c"
                               ,0x3ec);
  pvVar2 = __ckd_calloc__((ulong)((int)veclen * n_stream),4,
                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/kmeans_init/main.c"
                          ,0x3ee);
  uVar3 = 0;
  bVar4 = true;
  while (bVar4) {
    for (uVar5 = 0; n_stream != uVar5; uVar5 = uVar5 + 1) {
      (*pppfVar1)[uVar5] = (vector_t)((long)pvVar2 + (ulong)uVar3 * 4);
      uVar3 = uVar3 + *(int *)CONCAT44(in_register_00000034,n_density);
    }
    bVar4 = false;
  }
  return pppfVar1;
}

Assistant:

static vector_t **
alloc_gau_acc(uint32 n_stream,
	      uint32 n_density,
	      const uint32 *veclen,
	      uint32 blksize)
{
    vector_t **param;
    float32 *buf;
    uint32 j, k, l;

    param = (vector_t **) ckd_calloc_2d(n_stream, n_density,
					sizeof(vector_t));
    
    buf = ckd_calloc(n_density * blksize, sizeof(float32));

    for (j = 0, l = 0; j < n_stream; j++) {
	for (k = 0; k < n_density; k++) {
	    param[j][k] = &buf[l];

	    l += veclen[j];
	}
    }

    return param;
}